

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O3

void __thiscall
RenX_LoggingPlugin::RenX_OnExplode(RenX_LoggingPlugin *this,Server *server,string_view object)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  string msg;
  long *local_58;
  long local_50;
  long local_48 [2];
  code *local_38;
  
  if ((*(uint *)&this->field_0xa0 >> 0x17 & 1) == 0) {
    local_38 = RenX::Server::sendAdmChan;
  }
  else {
    local_38 = RenX::Server::sendLogChan;
  }
  local_58 = local_48;
  pcVar1 = (this->explodeNoOwnerFmt)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (this->explodeNoOwnerFmt)._M_string_length);
  if (local_50 != 0) {
    RenX::processTags((string *)&local_58,server,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                      (BuildingInfo *)0x0);
    uVar2 = *(undefined8 *)(RenX::tags + 0x14c8);
    uVar3 = *(undefined8 *)(RenX::tags + 0x14d0);
    auVar4 = RenX::translateName(object._M_len,object._M_str);
    RenX::replace_tag(&local_58,uVar3,uVar2,auVar4._0_8_,auVar4._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 0x14e8);
    uVar3 = *(undefined8 *)(RenX::tags + 0x14f0);
    auVar4 = RenX::translateName(object._M_len,object._M_str);
    RenX::replace_tag(&local_58,uVar3,uVar2,auVar4._0_8_,auVar4._8_8_);
    (*local_38)(server,local_50,local_58);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnExplode(RenX::Server &server, std::string_view object)
{
	logFuncType func;
	if (RenX_LoggingPlugin::explodePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->explodeNoOwnerFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_WEAPON_TAG, RenX::translateName(object));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_OBJECT_TAG, RenX::translateName(object));
		(server.*func)(msg);
	}
}